

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnReturnCallIndirect
          (SharedValidator *this,Location *loc,Var *sig_var,Var *table_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Result RVar5;
  FuncType func_type;
  FuncType local_f8;
  Var local_c0;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0x10,loc);
  Var::Var(&local_78,table_var);
  RVar2 = CheckTableIndex(this,&local_78,(TableType *)0x0);
  Var::~Var(&local_78);
  local_f8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Var::Var(&local_c0,sig_var);
  RVar3 = CheckFuncTypeIndex(this,&local_c0,&local_f8);
  Var::~Var(&local_c0);
  RVar4 = TypeChecker::OnReturnCallIndirect(&this->typechecker_,&local_f8.params,&local_f8.results);
  if (local_f8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  RVar5.enum_._1_3_ = 0;
  RVar5.enum_._0_1_ =
       (RVar4.enum_ == Error || RVar3.enum_ == Error) ||
       (RVar2.enum_ == Error || RVar1.enum_ == Error);
  return (Result)RVar5.enum_;
}

Assistant:

Result SharedValidator::OnReturnCallIndirect(const Location& loc,
                                             Var sig_var,
                                             Var table_var) {
  Result result = CheckInstr(Opcode::CallIndirect, loc);
  result |= CheckTableIndex(table_var);
  FuncType func_type;
  result |= CheckFuncTypeIndex(sig_var, &func_type);
  result |=
      typechecker_.OnReturnCallIndirect(func_type.params, func_type.results);
  return result;
}